

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.cpp
# Opt level: O0

bool __thiscall rw::BBox::containsPoint(BBox *this,V3d *point)

{
  bool local_19;
  V3d *point_local;
  BBox *this_local;
  
  local_19 = false;
  if (((((float)(this->inf).x <= (float)point->x) &&
       (local_19 = false, (float)point->x <= (float)(this->sup).x)) &&
      (local_19 = false, (float)(this->inf).y <= (float)point->y)) &&
     ((local_19 = false, (float)point->y <= (float)(this->sup).y &&
      (local_19 = false, (float)(this->inf).z <= (float)point->z)))) {
    local_19 = (float)point->z <= (float)(this->sup).z;
  }
  return local_19;
}

Assistant:

bool
BBox::containsPoint(V3d *point)
{
	return point->x >= this->inf.x && point->x <= this->sup.x &&
		point->y >= this->inf.y && point->y <= this->sup.y &&
		point->z >= this->inf.z && point->z <= this->sup.z;
}